

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O2

void AliasChecker::gatherAdditiveBase
               (Varnode *startvn,
               vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *addbase)

{
  int iVar1;
  Varnode *pVVar2;
  long *plVar3;
  pointer pAVar4;
  ulong uVar5;
  Varnode *pVVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  Varnode *pVVar9;
  bool bVar10;
  bool bVar11;
  vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> vnqueue;
  AddBase local_68;
  _Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> local_58;
  vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *local_40;
  ulong local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(byte *)&startvn->flags = (byte)startvn->flags | 1;
  local_68.index = (Varnode *)0x0;
  local_68.base = startvn;
  local_40 = addbase;
  std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
  emplace_back<AliasChecker::AddBase>
            ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)&local_58,
             &local_68);
  uVar7 = 0;
  do {
    uVar5 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58._M_impl.super__Vector_impl_data._M_start >> 4;
    pAVar4 = local_58._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 <= uVar7) {
      while (bVar11 = uVar5 != 0, uVar5 = uVar5 - 1, bVar11) {
        pAVar4->base->flags = pAVar4->base->flags & 0xfffffffe;
        pAVar4 = pAVar4 + 1;
      }
      std::_Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
      ~_Vector_base(&local_58);
      return;
    }
    pVVar2 = local_58._M_impl.super__Vector_impl_data._M_start[uVar7].base;
    pVVar9 = local_58._M_impl.super__Vector_impl_data._M_start[uVar7].index;
    local_38 = uVar7 + 1;
    p_Var8 = (_List_node_base *)&pVVar2->descend;
    bVar11 = false;
LAB_002b36a7:
    bVar10 = bVar11;
    uVar7 = local_38;
    p_Var8 = (((_List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_> *)&p_Var8->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var8 != (_List_node_base *)&pVVar2->descend) {
      plVar3 = (long *)p_Var8[1]._M_next;
      iVar1 = *(int *)(*plVar3 + 0x10);
      if (iVar1 - 0x42U < 2) {
LAB_002b36f6:
        pVVar6 = (Varnode *)plVar3[9];
        bVar11 = bVar10;
        if ((pVVar6->flags & 1) == 0) {
          pVVar6->flags = pVVar6->flags | 1;
          local_68.base = pVVar6;
          local_68.index = pVVar9;
          std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
          emplace_back<AliasChecker::AddBase>
                    ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)
                     &local_58,&local_68);
        }
        goto LAB_002b36a7;
      }
      bVar11 = true;
      if (iVar1 != 1) {
        if (iVar1 != 0x13) {
          if (iVar1 == 0x14) {
            pVVar6 = *(Varnode **)(plVar3[10] + 8);
            if (pVVar2 != pVVar6) {
              if ((pVVar6->flags & 2) == 0) {
                pVVar9 = pVVar6;
              }
              pVVar6 = (Varnode *)plVar3[9];
              bVar11 = bVar10;
              if ((pVVar6->flags & 1) == 0) {
                pVVar6->flags = pVVar6->flags | 1;
                local_68.base = pVVar6;
                local_68.index = pVVar9;
                std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
                emplace_back<AliasChecker::AddBase>
                          ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)
                           &local_58,&local_68);
              }
            }
            goto LAB_002b36a7;
          }
          if (iVar1 != 0x41) goto LAB_002b36a7;
        }
        pVVar6 = (Varnode *)((long *)plVar3[10])[1];
        if (pVVar6 == pVVar2) {
          pVVar6 = *(Varnode **)plVar3[10];
        }
        if ((pVVar6->flags & 2) == 0) {
          pVVar9 = pVVar6;
        }
        goto LAB_002b36f6;
      }
      pVVar6 = (Varnode *)plVar3[9];
      if ((pVVar6->flags & 1) == 0) {
        pVVar6->flags = pVVar6->flags | 1;
        local_68.base = pVVar6;
        local_68.index = pVVar9;
        std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
        emplace_back<AliasChecker::AddBase>
                  ((vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_> *)
                   &local_58,&local_68);
      }
      goto LAB_002b36a7;
    }
    if (bVar10) {
      local_68.base = pVVar2;
      local_68.index = pVVar9;
      std::vector<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>::
      emplace_back<AliasChecker::AddBase>(local_40,&local_68);
    }
  } while( true );
}

Assistant:

void AliasChecker::gatherAdditiveBase(Varnode *startvn,vector<AddBase> &addbase)

{
  vector<AddBase> vnqueue;		// varnodes involved in addition with original vn
  Varnode *vn,*subvn,*indexvn,*othervn;
  list<PcodeOp *>::const_iterator iter;
  PcodeOp *op;
  bool nonadduse;
  int4 i=0;

  vn = startvn;
  vn->setMark();
  vnqueue.push_back(AddBase(vn,(Varnode *)0));
  while(i<vnqueue.size()) {
    vn = vnqueue[i].base;
    indexvn = vnqueue[i++].index;
    nonadduse = false;
    for(iter=vn->beginDescend();iter!=vn->endDescend();++iter) {
      op = *iter;
      switch(op->code()) {
      case CPUI_COPY:
	nonadduse = true;	// Treat COPY as both non-add use and part of ADD expression
	subvn = op->getOut();
	if (!subvn->isMark()) {
	  subvn->setMark();
	  vnqueue.push_back(AddBase(subvn,indexvn));
	}
	break;
      case CPUI_INT_SUB:
	if (vn == op->getIn(1)) {	// Subtracting the pointer
	  nonadduse = true;
	  break;
	}
	othervn = op->getIn(1);
	if (!othervn->isConstant())
	  indexvn = othervn;
	subvn = op->getOut();
	if (!subvn->isMark()) {
	  subvn->setMark();
	  vnqueue.push_back(AddBase(subvn,indexvn));
	}
	break;
      case CPUI_INT_ADD:
      case CPUI_PTRADD:
	othervn = op->getIn(1);	// Check if something else is being added in besides a constant
	if (othervn == vn)
	  othervn = op->getIn(0);
	if (!othervn->isConstant())
	  indexvn = othervn;
	// fallthru
      case CPUI_PTRSUB:
      case CPUI_SEGMENTOP:
	subvn = op->getOut();
	if (!subvn->isMark()) {
	  subvn->setMark();
	  vnqueue.push_back(AddBase(subvn,indexvn));
	}
	break;
      default:
	nonadduse = true;	// Used in non-additive expression
      }
    }
    if (nonadduse)
      addbase.push_back(AddBase(vn,indexvn));
  }
  for(i=0;i<vnqueue.size();++i)
    vnqueue[i].base->clearMark();
}